

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 *pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  uint *puVar1;
  float fVar2;
  ushort uVar3;
  int iVar4;
  char cVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  void *pvVar10;
  ImFontGlyph *pIVar11;
  uint uVar12;
  char *text;
  float scale;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  uint c;
  uint local_9c;
  undefined1 local_98 [16];
  ulong local_88;
  uint *local_80;
  ImDrawVert *local_78;
  uint local_70;
  int local_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  char *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ImDrawList *local_38;
  
  if (text_end == (char *)0x0) {
    sVar7 = strlen(text_begin);
    text_end = text_begin + sVar7;
  }
  fVar13 = (float)(int)pos->y;
  local_98 = ZEXT416((uint)fVar13);
  if (fVar13 < clip_rect->w || fVar13 == clip_rect->w) {
    scale = size / this->FontSize;
    fVar14 = this->FontSize * scale;
    fVar13 = fVar13 + fVar14;
    fVar15 = clip_rect->y;
    _local_68 = ZEXT416((uint)pos->x);
    if (text_begin < text_end && fVar13 < fVar15) {
      do {
        local_98 = ZEXT416((uint)fVar13);
        pcVar8 = (char *)memchr(text_begin,10,(long)text_end - (long)text_begin);
        if (wrap_width <= 0.0) {
          text_begin = pcVar8 + 1;
          if (pcVar8 == (char *)0x0) {
            text_begin = text_end;
          }
        }
        else {
          if (pcVar8 == (char *)0x0) {
            pcVar8 = text_end;
          }
          pcVar9 = CalcWordWrapPositionA(this,scale,text_begin,pcVar8,wrap_width);
          pcVar8 = pcVar9;
          if (pcVar9 < text_end) {
            do {
              if ((*pcVar9 != ' ') && (pcVar8 = pcVar9, *pcVar9 != '\t')) break;
              pcVar9 = pcVar9 + 1;
              pcVar8 = text_end;
            } while (pcVar9 != text_end);
          }
          fVar15 = clip_rect->y;
          text_begin = pcVar8 + (*pcVar8 == '\n');
        }
        fVar13 = fVar14 + (float)local_98._0_4_;
      } while ((fVar13 < fVar15) && (text_begin < text_end));
    }
    pcVar8 = text_end;
    if ((wrap_width <= 0.0) && (10000 < (long)text_end - (long)text_begin)) {
      fVar13 = clip_rect->w;
      pcVar8 = text_begin;
      fVar15 = (float)local_98._0_4_;
      while ((fVar15 < fVar13 && (pcVar8 < text_end))) {
        pvVar10 = memchr(pcVar8,10,(long)text_end - (long)pcVar8);
        pcVar8 = (char *)((long)pvVar10 + 1);
        if (pvVar10 == (void *)0x0) {
          pcVar8 = text_end;
        }
        fVar15 = fVar15 + fVar14;
      }
    }
    if (text_begin != pcVar8) {
      local_48 = (float)(int)(float)local_68._0_4_;
      fStack_44 = (float)(int)(float)local_68._4_4_;
      fStack_40 = (float)(int)fStack_60;
      fStack_3c = (float)(int)fStack_5c;
      iVar6 = (int)pcVar8 - (int)text_begin;
      local_6c = iVar6 * 6;
      iVar4 = (draw_list->IdxBuffer).Size;
      ImDrawList::PrimReserve(draw_list,local_6c,iVar6 * 4);
      local_78 = draw_list->_VtxWritePtr;
      local_80 = draw_list->_IdxWritePtr;
      local_88 = (ulong)draw_list->_VtxCurrentIdx;
      local_70 = col | 0xffffff;
      local_50 = (char *)0x0;
      fVar13 = local_48;
      fVar15 = local_48;
      local_38 = draw_list;
LAB_001a023f:
      do {
        if (pcVar8 <= text_begin) break;
        local_68._0_4_ = fVar15;
        pcVar9 = local_50;
        text = text_begin;
        fVar16 = (float)local_98._0_4_;
        uVar17 = local_98._4_4_;
        uVar18 = local_98._8_4_;
        uVar19 = local_98._12_4_;
        fVar20 = fVar15;
        while (0.0 < wrap_width) {
          if (pcVar9 == (char *)0x0) {
            pcVar9 = CalcWordWrapPositionA(this,scale,text,pcVar8,(fVar13 - fVar20) + wrap_width);
            uVar17 = 0;
            uVar18 = 0;
            uVar19 = 0;
            fVar13 = local_48;
            fVar15 = (float)local_68._0_4_;
          }
          if (text < pcVar9) {
            local_98._4_4_ = uVar17;
            local_98._0_4_ = fVar16;
            local_98._8_4_ = uVar18;
            local_98._12_4_ = uVar19;
            text_begin = text;
            fVar15 = fVar20;
            local_50 = pcVar9;
            break;
          }
          fVar16 = fVar16 + fVar14;
          if (clip_rect->w <= fVar16 && fVar16 != clip_rect->w) goto LAB_001a062f;
          do {
            cVar5 = *text;
            if ((cVar5 != ' ') && (cVar5 != '\t')) goto LAB_001a02f2;
            text = text + 1;
          } while (text != pcVar8);
          cVar5 = *pcVar8;
          text = pcVar8;
LAB_001a02f2:
          text = text + (cVar5 == '\n');
          pcVar9 = (char *)0x0;
          fVar20 = fVar13;
          if (pcVar8 <= text) goto LAB_001a062f;
        }
        local_9c = (uint)*text_begin;
        if (*text_begin < '\0') {
          local_68._0_4_ = fVar15;
          iVar6 = ImTextCharFromUtf8(&local_9c,text_begin,pcVar8);
          text_begin = text_begin + iVar6;
          fVar13 = local_48;
          fVar15 = (float)local_68._0_4_;
        }
        else {
          text_begin = text_begin + 1;
        }
        if (0x1f < local_9c) {
LAB_001a03a2:
          if (((local_9c & 0xffff) < (uint)(this->IndexLookup).Size) &&
             (uVar3 = (this->IndexLookup).Data[local_9c & 0xffff], uVar3 != 0xffff)) {
            pIVar11 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar3 * 0x28);
          }
          else {
            pIVar11 = this->FallbackGlyph;
          }
          if (pIVar11 != (ImFontGlyph *)0x0) {
            fVar16 = pIVar11->AdvanceX;
            if (((undefined1  [40])*pIVar11 & (undefined1  [40])0x2) != (undefined1  [40])0x0) {
              fVar26 = pIVar11->X0 * scale + fVar15;
              fVar20 = clip_rect->z;
              if (fVar26 <= fVar20) {
                fVar27 = pIVar11->X1 * scale + fVar15;
                fVar2 = clip_rect->x;
                if (fVar2 <= fVar27) {
                  fVar28 = pIVar11->Y0 * scale + (float)local_98._0_4_;
                  fVar23 = pIVar11->Y1 * scale + (float)local_98._0_4_;
                  fVar21 = pIVar11->U0;
                  fVar25 = pIVar11->V0;
                  fVar24 = pIVar11->U1;
                  fVar22 = pIVar11->V1;
                  if (cpu_fine_clip) {
                    if (fVar26 < fVar2) {
                      fVar21 = fVar21 + (fVar24 - fVar21) *
                                        (1.0 - (fVar27 - fVar2) / (fVar27 - fVar26));
                      fVar26 = fVar2;
                    }
                    fVar2 = clip_rect->y;
                    if (fVar28 < fVar2) {
                      fVar25 = fVar25 + (fVar22 - fVar25) *
                                        (1.0 - (fVar23 - fVar2) / (fVar23 - fVar28));
                      fVar28 = fVar2;
                    }
                    if (fVar20 < fVar27) {
                      fVar24 = (fVar24 - fVar21) * ((fVar20 - fVar26) / (fVar27 - fVar26)) + fVar21;
                      fVar27 = fVar20;
                    }
                    fVar20 = clip_rect->w;
                    if (fVar20 < fVar23) {
                      fVar22 = (fVar22 - fVar25) * ((fVar20 - fVar28) / (fVar23 - fVar28)) + fVar25;
                      fVar23 = fVar20;
                    }
                    if (fVar23 <= fVar28) goto LAB_001a0625;
                  }
                  uVar12 = local_70;
                  if (((undefined1  [40])*pIVar11 & (undefined1  [40])0x1) == (undefined1  [40])0x0)
                  {
                    uVar12 = col;
                  }
                  (local_78->pos).x = fVar26;
                  (local_78->pos).y = fVar28;
                  local_78->col = uVar12;
                  (local_78->uv).x = fVar21;
                  (local_78->uv).y = fVar25;
                  local_78[1].pos.x = fVar27;
                  local_78[1].pos.y = fVar28;
                  local_78[1].col = uVar12;
                  local_78[1].uv.x = fVar24;
                  local_78[1].uv.y = fVar25;
                  local_78[2].pos.x = fVar27;
                  local_78[2].pos.y = fVar23;
                  local_78[2].col = uVar12;
                  local_78[2].uv.x = fVar24;
                  local_78[2].uv.y = fVar22;
                  local_78[3].pos.x = fVar26;
                  local_78[3].pos.y = fVar23;
                  local_78[3].col = uVar12;
                  local_78[3].uv.x = fVar21;
                  local_78[3].uv.y = fVar22;
                  uVar12 = (uint)local_88;
                  *local_80 = uVar12;
                  local_80[1] = uVar12 + 1;
                  local_80[2] = uVar12 + 2;
                  local_80[3] = uVar12;
                  local_80[4] = uVar12 + 2;
                  local_80[5] = uVar12 + 3;
                  local_78 = local_78 + 4;
                  local_88 = (ulong)(uVar12 + 4);
                  local_80 = local_80 + 6;
                }
              }
            }
LAB_001a0625:
            fVar15 = fVar15 + fVar16 * scale;
          }
          goto LAB_001a023f;
        }
        if (local_9c != 10) {
          if (local_9c != 0xd) goto LAB_001a03a2;
          goto LAB_001a023f;
        }
        local_98._0_4_ = (float)local_98._0_4_ + fVar14;
        fVar15 = fVar13;
      } while ((float)local_98._0_4_ < clip_rect->w || (float)local_98._0_4_ == clip_rect->w);
LAB_001a062f:
      (local_38->VtxBuffer).Size =
           (int)((ulong)((long)local_78 - (long)(local_38->VtxBuffer).Data) >> 2) * -0x33333333;
      iVar6 = (int)((ulong)((long)local_80 - (long)(local_38->IdxBuffer).Data) >> 2);
      (local_38->IdxBuffer).Size = iVar6;
      puVar1 = &(local_38->CmdBuffer).Data[(long)(local_38->CmdBuffer).Size + -1].ElemCount;
      *puVar1 = *puVar1 + (iVar6 - (iVar4 + local_6c));
      local_38->_VtxWritePtr = local_78;
      local_38->_IdxWritePtr = local_80;
      local_38->_VtxCurrentIdx = (uint)local_88;
    }
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, const ImVec2& pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui:: functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    float x = IM_TRUNC(pos.x);
    float y = IM_TRUNC(pos.y);
    if (y > clip_rect.w)
        return;

    const float start_x = x;
    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            const char* line_end = (const char*)memchr(s, '\n', text_end - s);
            if (word_wrap_enabled)
            {
                // FIXME-OPT: This is not optimal as do first do a search for \n before calling CalcWordWrapPositionA().
                // If the specs for CalcWordWrapPositionA() were reworked to optionally return on \n we could combine both.
                // However it is still better than nothing performing the fast-forward!
                s = CalcWordWrapPositionA(scale, s, line_end ? line_end : text_end, wrap_width);
                s = CalcWordWrapNextLineStartA(s, text_end);
            }
            else
            {
                s = line_end ? line_end + 1 : text_end;
            }
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);
    ImDrawVert*  vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx*   idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_index = draw_list->_VtxCurrentIdx;

    const ImU32 col_untinted = col | ~IM_COL32_A_MASK;
    const char* word_wrap_eol = NULL;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - start_x));

            if (s >= word_wrap_eol)
            {
                x = start_x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                word_wrap_eol = NULL;
                s = CalcWordWrapNextLineStartA(s, text_end); // Wrapping skips upcoming blanks
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
            s += 1;
        else
            s += ImTextCharFromUtf8(&c, s, text_end);

        if (c < 32)
        {
            if (c == '\n')
            {
                x = start_x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        const ImFontGlyph* glyph = FindGlyph((ImWchar)c);
        if (glyph == NULL)
            continue;

        float char_width = glyph->AdvanceX * scale;
        if (glyph->Visible)
        {
            // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
            float x1 = x + glyph->X0 * scale;
            float x2 = x + glyph->X1 * scale;
            float y1 = y + glyph->Y0 * scale;
            float y2 = y + glyph->Y1 * scale;
            if (x1 <= clip_rect.z && x2 >= clip_rect.x)
            {
                // Render a character
                float u1 = glyph->U0;
                float v1 = glyph->V0;
                float u2 = glyph->U1;
                float v2 = glyph->V1;

                // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                if (cpu_fine_clip)
                {
                    if (x1 < clip_rect.x)
                    {
                        u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                        x1 = clip_rect.x;
                    }
                    if (y1 < clip_rect.y)
                    {
                        v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                        y1 = clip_rect.y;
                    }
                    if (x2 > clip_rect.z)
                    {
                        u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                        x2 = clip_rect.z;
                    }
                    if (y2 > clip_rect.w)
                    {
                        v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                        y2 = clip_rect.w;
                    }
                    if (y1 >= y2)
                    {
                        x += char_width;
                        continue;
                    }
                }

                // Support for untinted glyphs
                ImU32 glyph_col = glyph->Colored ? col_untinted : col;

                // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                {
                    vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = glyph_col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                    vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = glyph_col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                    vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = glyph_col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                    vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = glyph_col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                    idx_write[0] = (ImDrawIdx)(vtx_index); idx_write[1] = (ImDrawIdx)(vtx_index + 1); idx_write[2] = (ImDrawIdx)(vtx_index + 2);
                    idx_write[3] = (ImDrawIdx)(vtx_index); idx_write[4] = (ImDrawIdx)(vtx_index + 2); idx_write[5] = (ImDrawIdx)(vtx_index + 3);
                    vtx_write += 4;
                    vtx_index += 4;
                    idx_write += 6;
                }
            }
        }
        x += char_width;
    }

    // Give back unused vertices (clipped ones, blanks) ~ this is essentially a PrimUnreserve() action.
    draw_list->VtxBuffer.Size = (int)(vtx_write - draw_list->VtxBuffer.Data); // Same as calling shrink()
    draw_list->IdxBuffer.Size = (int)(idx_write - draw_list->IdxBuffer.Data);
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = vtx_index;
}